

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void xmlFreeNodeList(xmlNodePtr cur)

{
  xmlDocPtr pxVar1;
  xmlDocPtr pxVar2;
  _xmlDtd *p_Var3;
  xmlElementType xVar4;
  int iVar5;
  xmlDeregisterNodeFunc *pp_Var6;
  xmlChar *str;
  _xmlDtd *p_Var7;
  long lVar8;
  xmlDictPtr local_38;
  
  if (cur == (xmlNodePtr)0x0) {
    return;
  }
  if (cur->type == XML_NAMESPACE_DECL) {
    xmlFreeNsList((xmlNsPtr)cur);
    return;
  }
  if (cur->doc == (_xmlDoc *)0x0) {
    local_38 = (xmlDictPtr)0x0;
  }
  else {
    local_38 = cur->doc->dict;
  }
  lVar8 = 0;
  do {
    pxVar1 = (xmlDocPtr)((xmlDocPtr)cur)->children;
    while ((pxVar2 = pxVar1, pxVar2 != (xmlDocPtr)0x0 &&
           ((XML_DTD_NODE < ((xmlDocPtr)cur)->type ||
            ((0x6220U >> (((xmlDocPtr)cur)->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)
            )))) {
      lVar8 = lVar8 + 1;
      pxVar1 = (xmlDocPtr)pxVar2->children;
      cur = (xmlNodePtr)pxVar2;
    }
    pxVar1 = (xmlDocPtr)((xmlDocPtr)cur)->next;
    pxVar2 = (xmlDocPtr)((xmlDocPtr)cur)->parent;
    xVar4 = ((xmlDocPtr)cur)->type;
    if (xVar4 == XML_DOCUMENT_NODE) {
LAB_001818e6:
      xmlFreeDoc((xmlDocPtr)cur);
    }
    else if (xVar4 != XML_DTD_NODE) {
      if (xVar4 == XML_HTML_DOCUMENT_NODE) goto LAB_001818e6;
      if (__xmlRegisterCallbacks != 0) {
        pp_Var6 = __xmlDeregisterNodeDefaultValue();
        if (*pp_Var6 != (xmlDeregisterNodeFunc)0x0) {
          pp_Var6 = __xmlDeregisterNodeDefaultValue();
          (**pp_Var6)(cur);
        }
        xVar4 = ((xmlDocPtr)cur)->type;
      }
      if (((xVar4 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
          ((0x180002U >> (xVar4 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) &&
         (p_Var7 = ((xmlDocPtr)cur)->extSubset, p_Var7 != (_xmlDtd *)0x0)) {
        do {
          p_Var3 = (_xmlDtd *)p_Var7->next;
          xmlFreeProp((xmlAttrPtr)p_Var7);
          p_Var7 = p_Var3;
        } while (p_Var3 != (_xmlDtd *)0x0);
        xVar4 = ((xmlDocPtr)cur)->type;
      }
      if ((XML_XINCLUDE_END < xVar4) ||
         ((0x180022U >> (xVar4 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) {
        p_Var7 = ((xmlDocPtr)cur)->intSubset;
        if (p_Var7 != (_xmlDtd *)0x0 && p_Var7 != (_xmlDtd *)&((xmlDocPtr)cur)->extSubset) {
          if (local_38 != (xmlDictPtr)0x0) {
            iVar5 = xmlDictOwns(local_38,(xmlChar *)p_Var7);
            if (iVar5 != 0) goto LAB_00181a12;
            p_Var7 = ((xmlDocPtr)cur)->intSubset;
          }
          (*xmlFree)(p_Var7);
        }
LAB_00181a12:
        xVar4 = ((xmlDocPtr)cur)->type;
      }
      if (((xVar4 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
          ((0x180002U >> (xVar4 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) &&
         (((xmlDocPtr)cur)->oldNs != (xmlNsPtr)0x0)) {
        xmlFreeNsList(((xmlDocPtr)cur)->oldNs);
      }
      str = (xmlChar *)((xmlDocPtr)cur)->name;
      if (((str != (xmlChar *)0x0) && (((xmlDocPtr)cur)->type != XML_TEXT_NODE)) &&
         (((xmlDocPtr)cur)->type != XML_COMMENT_NODE)) {
        if (local_38 != (xmlDictPtr)0x0) {
          iVar5 = xmlDictOwns(local_38,str);
          if (iVar5 != 0) goto LAB_001819af;
          str = (xmlChar *)((xmlDocPtr)cur)->name;
        }
        (*xmlFree)(str);
      }
LAB_001819af:
      (*xmlFree)(cur);
    }
    cur = (xmlNodePtr)pxVar1;
    if (pxVar1 == (xmlDocPtr)0x0) {
      if (lVar8 == 0) {
        return;
      }
      if (pxVar2 == (xmlDocPtr)0x0) {
        return;
      }
      lVar8 = lVar8 + -1;
      pxVar2->children = (_xmlNode *)0x0;
      cur = (xmlNodePtr)pxVar2;
    }
  } while( true );
}

Assistant:

void
xmlFreeNodeList(xmlNodePtr cur) {
    xmlNodePtr next;
    xmlNodePtr parent;
    xmlDictPtr dict = NULL;
    size_t depth = 0;

    if (cur == NULL) return;
    if (cur->type == XML_NAMESPACE_DECL) {
	xmlFreeNsList((xmlNsPtr) cur);
	return;
    }
    if (cur->doc != NULL) dict = cur->doc->dict;
    while (1) {
        while ((cur->children != NULL) &&
               (cur->type != XML_DOCUMENT_NODE) &&
               (cur->type != XML_HTML_DOCUMENT_NODE) &&
               (cur->type != XML_DTD_NODE) &&
               (cur->type != XML_ENTITY_REF_NODE)) {
            cur = cur->children;
            depth += 1;
        }

        next = cur->next;
        parent = cur->parent;
	if ((cur->type == XML_DOCUMENT_NODE) ||
            (cur->type == XML_HTML_DOCUMENT_NODE)) {
            xmlFreeDoc((xmlDocPtr) cur);
        } else if (cur->type != XML_DTD_NODE) {

	    if ((__xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
		xmlDeregisterNodeDefaultValue(cur);

	    if (((cur->type == XML_ELEMENT_NODE) ||
		 (cur->type == XML_XINCLUDE_START) ||
		 (cur->type == XML_XINCLUDE_END)) &&
		(cur->properties != NULL))
		xmlFreePropList(cur->properties);
	    if ((cur->type != XML_ELEMENT_NODE) &&
		(cur->type != XML_XINCLUDE_START) &&
		(cur->type != XML_XINCLUDE_END) &&
		(cur->type != XML_ENTITY_REF_NODE) &&
		(cur->content != (xmlChar *) &(cur->properties))) {
		DICT_FREE(cur->content)
	    }
	    if (((cur->type == XML_ELEMENT_NODE) ||
	         (cur->type == XML_XINCLUDE_START) ||
		 (cur->type == XML_XINCLUDE_END)) &&
		(cur->nsDef != NULL))
		xmlFreeNsList(cur->nsDef);

	    /*
	     * When a node is a text node or a comment, it uses a global static
	     * variable for the name of the node.
	     * Otherwise the node name might come from the document's
	     * dictionary
	     */
	    if ((cur->name != NULL) &&
		(cur->type != XML_TEXT_NODE) &&
		(cur->type != XML_COMMENT_NODE))
		DICT_FREE(cur->name)
	    xmlFree(cur);
	}

        if (next != NULL) {
	    cur = next;
        } else {
            if ((depth == 0) || (parent == NULL))
                break;
            depth -= 1;
            cur = parent;
            cur->children = NULL;
        }
    }
}